

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_consts
          (t_cpp_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  t_type *ttype;
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  _func_int **pp_Var7;
  long *plVar8;
  pointer pptVar9;
  _Alloc_hider _Var10;
  string name;
  string f_consts_name;
  string f_consts_impl_name;
  ofstream_with_content_based_conditional_update f_consts_impl;
  ofstream_with_content_based_conditional_update f_consts;
  string local_438;
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  vector<t_const_*,_std::allocator<t_const_*>_> *local_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  string local_3d0;
  string local_3b0;
  string local_390;
  undefined1 local_370 [16];
  _func_int *local_360;
  long lStack_358;
  string local_300 [32];
  undefined1 local_2e0;
  ios_base local_2d8 [264];
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_370,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             (local_370,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  pp_Var7 = (_func_int **)(plVar5 + 2);
  if ((_func_int **)*plVar5 == pp_Var7) {
    local_1c0 = *pp_Var7;
    lStack_1b8 = plVar5[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var7;
    local_1d0._0_8_ = (_func_int **)*plVar5;
  }
  local_1d0._8_8_ = plVar5[1];
  *plVar5 = (long)pp_Var7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_1d0);
  local_418 = &local_408;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_408 = *plVar8;
    lStack_400 = plVar5[3];
  }
  else {
    local_408 = *plVar8;
    local_418 = (long *)*plVar5;
  }
  local_410 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if ((_func_int **)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  if ((consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::_M_assign(local_160);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
               *)local_1d0);
    local_140 = 0;
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_438,this);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_438,
                                (ulong)(this->super_t_oop_generator).super_t_generator.program_name_
                                       ._M_dataplus._M_p);
    pp_Var7 = (_func_int **)(plVar5 + 2);
    if ((_func_int **)*plVar5 == pp_Var7) {
      local_360 = *pp_Var7;
      lStack_358 = plVar5[3];
      local_370._0_8_ = &local_360;
    }
    else {
      local_360 = *pp_Var7;
      local_370._0_8_ = (_func_int **)*plVar5;
    }
    local_370._8_8_ = plVar5[1];
    *plVar5 = (long)pp_Var7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_370);
    local_3f0 = &local_3e0;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_3e0 = *plVar8;
      lStack_3d8 = plVar5[3];
    }
    else {
      local_3e0 = *plVar8;
      local_3f0 = (long *)*plVar5;
    }
    local_3e8 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((_func_int **)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_);
    }
    paVar1 = &local_438.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_370);
    std::__cxx11::string::_M_assign(local_300);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
               *)local_370);
    local_2e0 = 0;
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_438,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,local_438._M_dataplus._M_p,local_438._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_438,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_370,local_438._M_dataplus._M_p,local_438._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"#ifndef ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,
                        (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_CONSTANTS_H",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#define ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_CONSTANTS_H",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#include \"",10);
    get_include_prefix_abi_cxx11_
              (&local_438,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_438._M_dataplus._M_p,local_438._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types.h\"",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->ns_open_)._M_dataplus._M_p,(this->ns_open_)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"#include \"",10);
    get_include_prefix_abi_cxx11_
              (&local_438,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_370,local_438._M_dataplus._M_p,local_438._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_constants.h\"",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->ns_open_)._M_dataplus._M_p,(this->ns_open_)._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"class ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,
                        (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Constants {",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," public:",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Constants();",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar4 = (this->super_t_oop_generator).super_t_generator.indent_;
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + 1;
    pptVar9 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_3f8 = consts;
    if (pptVar9 !=
        (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
        local_438._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
        ttype = (*pptVar9)->type_;
        t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d0,local_3b0._M_dataplus._M_p,
                            local_3b0._M_string_length);
        type_name_abi_cxx11_(&local_3d0,this,ttype,false,false);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_438._M_dataplus._M_p,local_438._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != paVar1) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (local_3f8->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
      iVar4 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
    }
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"};",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_370,"const ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_370,
                        (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.program_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Constants g_",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_constants;",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Constants::",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Constants() {",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pvVar3 = local_3f8;
    iVar4 = (this->super_t_oop_generator).super_t_generator.indent_;
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + 1;
    pptVar9 = (local_3f8->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (local_3f8->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pcVar2 = ((*pptVar9)->name_)._M_dataplus._M_p;
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_390,pcVar2,pcVar2 + ((*pptVar9)->name_)._M_string_length);
        print_const_value(this,(ostream *)local_370,&local_390,(*pptVar9)->type_,(*pptVar9)->value_)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p);
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (pvVar3->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
      iVar4 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
    }
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar4;
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_370);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"extern const ",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Constants g_",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.program_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.program_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_constants;",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->ns_close_)._M_dataplus._M_p,(this->ns_close_)._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"#endif",6);
    _Var10 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_1d0,(int)_Var10._M_p);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_370,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->ns_close_)._M_dataplus._M_p,(this->ns_close_)._M_string_length
                       );
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    _Var10 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_370,(int)_Var10._M_p);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    ~template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_370,
               &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>
                ::VTT);
    std::ios_base::~ios_base(local_2d8);
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_418 != &local_408) {
    operator_delete(local_418);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_consts(std::vector<t_const*> consts) {
  string f_consts_name = get_out_dir() + program_name_ + "_constants.h";
  ofstream_with_content_based_conditional_update f_consts;
  if (consts.size() > 0) {
    f_consts.open(f_consts_name);

    string f_consts_impl_name = get_out_dir() + program_name_ + "_constants.cpp";
    ofstream_with_content_based_conditional_update f_consts_impl;
    f_consts_impl.open(f_consts_impl_name);

    // Print header
    f_consts << autogen_comment();
    f_consts_impl << autogen_comment();

    // Start ifndef
    f_consts << "#ifndef " << program_name_ << "_CONSTANTS_H" << endl << "#define " << program_name_
             << "_CONSTANTS_H" << endl << endl << "#include \"" << get_include_prefix(*get_program())
             << program_name_ << "_types.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts_impl << "#include \"" << get_include_prefix(*get_program()) << program_name_
                  << "_constants.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts << "class " << program_name_ << "Constants {" << endl << " public:" << endl << "  "
             << program_name_ << "Constants();" << endl << endl;
    indent_up();
    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      string name = (*c_iter)->get_name();
      t_type* type = (*c_iter)->get_type();
      f_consts << indent() << type_name(type) << " " << name << ";" << endl;
    }
    indent_down();
    f_consts << "};" << endl;

    f_consts_impl << "const " << program_name_ << "Constants g_" << program_name_ << "_constants;"
                  << endl << endl << program_name_ << "Constants::" << program_name_
                  << "Constants() {" << endl;
    indent_up();
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      print_const_value(f_consts_impl,
                        (*c_iter)->get_name(),
                        (*c_iter)->get_type(),
                        (*c_iter)->get_value());
    }
    indent_down();
    indent(f_consts_impl) << "}" << endl;

    f_consts << endl << "extern const " << program_name_ << "Constants g_" << program_name_
             << "_constants;" << endl << endl << ns_close_ << endl << endl << "#endif" << endl;
    f_consts.close();

    f_consts_impl << endl << ns_close_ << endl << endl;
    f_consts_impl.close();
  }
}